

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O2

bool SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::$_5
     ::__invoke(Search::search__unsigned_long_unsigned_int__float__
               (search *sch,size_t t,action *a,float *a_cost)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  lVar1 = *(long *)((long)sch->metatask_data + 0x10);
  lVar4 = *(long *)((long)sch->metatask_data + 0x78) * 0x28;
  lVar2 = *(long *)(lVar1 + 8 + lVar4);
  uVar3 = *(long *)(lVar1 + 0x10 + lVar4) - lVar2 >> 3;
  if (t < uVar3) {
    *a = *(action *)(lVar2 + t * 8);
    *a_cost = *(float *)(*(long *)(lVar1 + lVar4 + 8) + 4 + t * 8);
  }
  return t < uVar3;
}

Assistant:

T* get_metatask_data()
  {
    return (T*)metatask_data;
  }